

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939cat.c
# Opt level: O3

int j1939cat_recv_err(j1939cat_priv *priv)

{
  scm_timestamping *psVar1;
  uint uVar2;
  ssize_t sVar3;
  cmsghdr *__cmsg;
  int *piVar4;
  __u32 __errnum;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  sock_extended_err *serr;
  sock_extended_err *psVar8;
  scm_timestamping *tss;
  ulong uVar9;
  char control [200];
  msghdr local_130;
  cmsghdr local_f8 [12];
  
  local_130.msg_name = (void *)0x0;
  local_130.msg_namelen = 0;
  local_130.msg_iov = (iovec *)0x0;
  local_130.msg_iovlen = 0;
  local_130.msg_control = local_f8;
  local_130.msg_controllen = 200;
  local_130.msg_flags = 0;
  sVar3 = recvmsg(priv->sock,&local_130,0x2000);
  if ((int)sVar3 == -1) {
    piVar4 = __errno_location();
    err(1,"recvmsg error notification: %i",*piVar4);
  }
  if ((local_130.msg_flags & 8U) != 0) {
    err(1,"recvmsg error notification: truncated");
  }
  priv->serr = (sock_extended_err *)0x0;
  priv->tss = (scm_timestamping *)0x0;
  if ((cmsghdr *)local_130.msg_control != (cmsghdr *)0x0 && 0xf < local_130.msg_controllen) {
    __cmsg = (cmsghdr *)local_130.msg_control;
    do {
      if (__cmsg->cmsg_len == 0) {
        return 0;
      }
      iVar7 = __cmsg->cmsg_type;
      if (__cmsg->cmsg_level == 0x6b) {
        if (iVar7 != 4) goto LAB_00102f7d;
        psVar8 = (sock_extended_err *)(__cmsg + 1);
        priv->serr = psVar8;
LAB_00102f94:
        psVar1 = priv->tss;
        if (psVar1 != (scm_timestamping *)0x0) {
          if (psVar8->ee_origin == '\x01') {
            switch(psVar8->ee_info) {
            case 1:
              j1939cat_print_timestamp(priv,"TX ABT",(timespec *)psVar1->ts[0].tv_sec);
              __errnum = psVar8->ee_errno;
              pcVar5 = strerror(__errnum);
              pcVar6 = "serr: tx error: %i, %s";
              break;
            case 2:
              (priv->stats).tskey = psVar8->ee_data;
              j1939cat_print_timestamp(priv,"RX RTS",(timespec *)psVar1->ts[0].tv_sec);
              fprintf(_stderr,
                      "  total size: %u, pgn=0x%05x, sa=0x%02x, da=0x%02x src_name=0x%08lx, dst_name=0x%08lx)\n"
                      ,(ulong)(priv->stats).total,(ulong)(priv->stats).pgn,(ulong)(priv->stats).sa,
                      (ulong)(priv->stats).da,(int)(priv->stats).src_name,
                      (int)(priv->stats).dst_name);
              priv->last_dpo = -1;
              return 0;
            case 3:
              (priv->stats).tskey = psVar8->ee_data;
              j1939cat_print_timestamp(priv,"RX DPO",(timespec *)psVar1->ts[0].tv_sec);
              uVar2 = (priv->stats).send;
              if (priv->last_dpo != 0xffffffff && uVar2 <= (uint)priv->last_dpo) {
                warnx("same dpo? current: %i, last: %i");
                uVar2 = (priv->stats).send;
              }
              priv->last_dpo = uVar2;
              return 0;
            case 4:
              j1939cat_print_timestamp(priv,"RX ABT",(timespec *)psVar1->ts[0].tv_sec);
              __errnum = psVar8->ee_errno;
              pcVar5 = strerror(__errnum);
              pcVar6 = "serr: rx error: %i, %s";
              break;
            default:
              warnx("serr: unknown ee_info: %i");
              return -0x5f;
            }
            warnx(pcVar6,__errnum,pcVar5);
            return psVar8->ee_errno;
          }
          if (psVar8->ee_origin == '\x04') {
            if (psVar8->ee_errno != 0x2a) {
              warnx("serr: expected ENOMSG, got: %i");
            }
            (priv->stats).tskey = psVar8->ee_data;
            if ((ulong)psVar8->ee_info < 3) {
              pcVar5 = &DAT_00105290 + *(int *)(&DAT_00105290 + (ulong)psVar8->ee_info * 4);
            }
            else {
              pcVar5 = "   unk";
            }
            j1939cat_print_timestamp(priv,pcVar5,(timespec *)psVar1->ts[0].tv_sec);
            return (uint)(psVar8->ee_info != 1) * 4 + -4;
          }
          warnx("serr: wrong origin: %u");
          return 0;
        }
      }
      else {
        if (__cmsg->cmsg_level == 1) {
          if (iVar7 == 0x36) {
            iVar7 = (int)__cmsg->cmsg_len + -0x10;
            if (0 < iVar7) {
              uVar2 = 0;
              do {
                uVar9 = (ulong)uVar2;
                switch(*(undefined2 *)((long)&__cmsg[1].cmsg_len + uVar9 + 2)) {
                case 1:
                  (priv->stats).send = *(uint32_t *)((long)&__cmsg[1].cmsg_len + uVar9 + 4);
                  break;
                case 2:
                  (priv->stats).total = *(uint32_t *)((long)&__cmsg[1].cmsg_len + uVar9 + 4);
                  break;
                case 3:
                  (priv->stats).pgn = *(uint32_t *)((long)&__cmsg[1].cmsg_len + uVar9 + 4);
                  break;
                case 4:
                  (priv->stats).src_name = *(uint64_t *)((long)&__cmsg[1].cmsg_len + uVar9 + 4);
                  break;
                case 5:
                  (priv->stats).dst_name = *(uint64_t *)((long)&__cmsg[1].cmsg_len + uVar9 + 4);
                  break;
                case 6:
                  (priv->stats).sa = *(uint8_t *)((long)&__cmsg[1].cmsg_len + uVar9 + 4);
                  break;
                case 7:
                  (priv->stats).da = *(uint8_t *)((long)&__cmsg[1].cmsg_len + uVar9 + 4);
                  break;
                default:
                  warnx("not supported J1939_NLA field\n");
                }
                uVar2 = (*(ushort *)((long)&__cmsg[1].cmsg_len + uVar9) + 3 & 0xfffffffc) + uVar2;
              } while ((int)uVar2 < iVar7);
            }
          }
          else {
            if (iVar7 != 0x25) goto LAB_00102f7d;
            priv->tss = (scm_timestamping *)(__cmsg + 1);
          }
        }
        else {
LAB_00102f7d:
          warnx("serr: not supported type: %d.%d");
        }
        psVar8 = priv->serr;
        if (psVar8 != (sock_extended_err *)0x0) goto LAB_00102f94;
      }
      __cmsg = __cmsg_nxthdr(&local_130,__cmsg);
    } while (__cmsg != (cmsghdr *)0x0);
  }
  return 0;
}

Assistant:

static int j1939cat_recv_err(struct j1939cat_priv *priv)
{
	char control[200];
	struct cmsghdr *cm;
	int ret;
	struct msghdr msg = {
		.msg_control = control,
		.msg_controllen = sizeof(control),
	};

	ret = recvmsg(priv->sock, &msg, MSG_ERRQUEUE);
	if (ret == -1)
		err(EXIT_FAILURE, "recvmsg error notification: %i", errno);
	if (msg.msg_flags & MSG_CTRUNC)
		err(EXIT_FAILURE, "recvmsg error notification: truncated");

	priv->serr = NULL;
	priv->tss = NULL;

	for (cm = CMSG_FIRSTHDR(&msg); cm && cm->cmsg_len;
	     cm = CMSG_NXTHDR(&msg, cm)) {
		j1939cat_parse_cm(priv, cm);
		if (priv->serr && priv->tss)
			return j1939cat_extract_serr(priv);
	}

	return 0;
}